

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandFlowRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fBackwardOnly;
  uint fFastButConservative;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  ulong uVar4;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  char *pcVar6;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  ulong local_50;
  ulong local_48;
  undefined4 extraout_var;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_6c = 0;
  Extra_UtilGetoptReset();
  local_74 = 1;
  local_50 = 999;
  fBackwardOnly = 0;
  local_68 = 0;
  local_70 = 0;
  local_64 = 0;
  fFastButConservative = 0;
  local_48 = 0;
LAB_001fbc20:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"MDfcgbkivh");
    iVar3 = globalUtilOptind;
    switch(iVar1) {
    case 0x62:
      fBackwardOnly = fBackwardOnly ^ 1;
      goto LAB_001fbc20;
    case 99:
      fFastButConservative = fFastButConservative ^ 1;
      goto LAB_001fbc20;
    case 100:
    case 0x65:
    case 0x68:
    case 0x6a:
      goto switchD_001fbc3d_caseD_64;
    case 0x66:
      local_6c = local_6c ^ 1;
      goto LAB_001fbc20;
    case 0x67:
      local_70 = local_70 ^ 1;
      goto LAB_001fbc20;
    case 0x69:
      local_74 = local_74 ^ 1;
      goto LAB_001fbc20;
    case 0x6b:
      local_64 = local_64 ^ 1;
      goto LAB_001fbc20;
    }
    if (iVar1 == 0x44) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-D\" should be followed by a positive integer.\n";
LAB_001fbd23:
        Abc_Print(-1,pcVar5);
        goto switchD_001fbc3d_caseD_64;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      uVar4 = (ulong)uVar2;
      local_48 = uVar4;
    }
    else {
      if (iVar1 != 0x4d) {
        if (iVar1 != 0x76) {
          if (iVar1 == -1) {
            if (pNtk == (Abc_Ntk_t *)0x0) {
              pcVar5 = "Empty network.\n";
            }
            else if (fBackwardOnly == 0 || local_6c == 0) {
              if (local_74 != 0 || local_70 == 0) {
                if (pNtk->nObjCounts[8] == 0) {
                  pcVar5 = "The network has no latches. Retiming is not performed.\n";
                }
                else {
                  iVar3 = Abc_NtkGetChoiceNum(pNtk);
                  if (iVar3 == 0) {
                    pNtk_00 = Abc_FlowRetime_MinReg
                                        (pNtk,local_68,local_74,local_70,local_64,local_6c,
                                         fBackwardOnly,(int)local_50,(int)local_48,
                                         fFastButConservative);
                    if (pNtk_00 == pNtk) {
                      return 0;
                    }
                    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
                    return 0;
                  }
                  pcVar5 = "Retiming with choice nodes is not implemented.\n";
                }
                Abc_Print(-1,pcVar5);
                return 0;
              }
              pcVar5 = "Initial state guarantee (-g) requires initial state computation (-i).\n";
            }
            else {
              pcVar5 = "Only one switch \"-f\" or \"-b\" can be selected at a time.\n";
            }
            iVar3 = -1;
            goto LAB_001fbe50;
          }
          goto switchD_001fbc3d_caseD_64;
        }
        local_68 = local_68 ^ 1;
        goto LAB_001fbc20;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-M\" should be followed by a positive integer.\n";
        goto LAB_001fbd23;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      uVar4 = CONCAT44(extraout_var,iVar1);
      local_50 = uVar4;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar4 < 0) {
switchD_001fbc3d_caseD_64:
      iVar3 = -2;
      Abc_Print(-2,"usage: fretime [-M num] [-D num] [-fbvih]\n");
      Abc_Print(-2,"\t         retimes the current network using flow-based algorithm\n");
      Abc_Print(-2,"\t-M num : the maximum number of iterations [default = %d]\n",local_50);
      Abc_Print(-2,"\t-D num : the maximum delay [default = none]\n");
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_74 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-i     : enables init state computation [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_64 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-k     : blocks retiming over const nodes [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_70 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-g     : guarantees init state computation [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (fFastButConservative == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-c     : very fast (but conserv.) delay constraints [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_6c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-f     : enables forward-only retiming  [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (fBackwardOnly == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-b     : enables backward-only retiming [default = %s]\n",pcVar5);
      if (local_68 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : enables verbose output [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_001fbe50:
      Abc_Print(iVar3,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandFlowRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nMaxIters;
    int fForward;
    int fBackward;
    int fVerbose;
    int fComputeInit, fGuaranteeInit, fBlockConst;
    int fFastButConservative;
    int maxDelay;

    extern Abc_Ntk_t* Abc_FlowRetime_MinReg( Abc_Ntk_t * pNtk, int fVerbose,
                                             int fComputeInit, int fGuaranteeInit, int fBlockConst,
                                             int fForward, int fBackward, int nMaxIters,
                                             int maxDelay, int fFastButConservative);

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fForward  =  0;
    fFastButConservative = 0;
    fBackward =  0;
    fComputeInit =  1;
    fGuaranteeInit =  0;
    fVerbose  =  0;
    fBlockConst  =  0;
    nMaxIters = 999;
    maxDelay  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MDfcgbkivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nMaxIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxIters < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            maxDelay = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( maxDelay < 0 )
                goto usage;
           break;
        case 'f':
            fForward ^= 1;
            break;
        case 'c':
            fFastButConservative ^= 1;
            break;
        case 'i':
            fComputeInit ^= 1;
            break;
        case 'b':
            fBackward ^= 1;
            break;
        case 'g':
            fGuaranteeInit ^= 1;
            break;
        case 'k':
            fBlockConst ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fForward && fBackward )
    {
        Abc_Print( -1, "Only one switch \"-f\" or \"-b\" can be selected at a time.\n" );
        return 1;
    }

    if ( fGuaranteeInit && !fComputeInit )
    {
      Abc_Print( -1, "Initial state guarantee (-g) requires initial state computation (-i).\n" );
      return 1;
    }

    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network has no latches. Retiming is not performed.\n" );
        return 0;
    }

    if ( Abc_NtkGetChoiceNum(pNtk) )
      {
        Abc_Print( -1, "Retiming with choice nodes is not implemented.\n" );
        return 0;
      }

    // perform the retiming
    pNtkRes = Abc_FlowRetime_MinReg( pNtk, fVerbose, fComputeInit,
                                     fGuaranteeInit, fBlockConst,
                                     fForward, fBackward,
                                     nMaxIters, maxDelay, fFastButConservative );

    if (pNtkRes != pNtk)
      Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );

    return 0;

usage:
    Abc_Print( -2, "usage: fretime [-M num] [-D num] [-fbvih]\n" );
    Abc_Print( -2, "\t         retimes the current network using flow-based algorithm\n" );
    Abc_Print( -2, "\t-M num : the maximum number of iterations [default = %d]\n", nMaxIters );
    Abc_Print( -2, "\t-D num : the maximum delay [default = none]\n" );
    Abc_Print( -2, "\t-i     : enables init state computation [default = %s]\n", fComputeInit? "yes": "no" );
    Abc_Print( -2, "\t-k     : blocks retiming over const nodes [default = %s]\n", fBlockConst? "yes": "no" );
    Abc_Print( -2, "\t-g     : guarantees init state computation [default = %s]\n", fGuaranteeInit? "yes": "no" );
    Abc_Print( -2, "\t-c     : very fast (but conserv.) delay constraints [default = %s]\n", fFastButConservative? "yes": "no" );
    Abc_Print( -2, "\t-f     : enables forward-only retiming  [default = %s]\n", fForward? "yes": "no" );
    Abc_Print( -2, "\t-b     : enables backward-only retiming [default = %s]\n", fBackward? "yes": "no" );
    Abc_Print( -2, "\t-v     : enables verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}